

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_safe_forceExtDict
              (char *source,char *dest,int compressedSize,int maxOutputSize,void *dictStart,
              size_t dictSize)

{
  ushort *puVar1;
  BYTE *pBVar2;
  byte *pbVar3;
  byte bVar4;
  BYTE BVar5;
  undefined8 uVar6;
  ushort uVar7;
  ushort uVar8;
  char cVar9;
  U32 length;
  uint uVar10;
  uint uVar11;
  long lVar12;
  BYTE *pBVar13;
  ushort *puVar14;
  int iVar15;
  ushort *puVar16;
  BYTE *pBVar17;
  BYTE *pBVar18;
  ulong uVar19;
  BYTE *pBVar20;
  BYTE *pBVar21;
  long lVar22;
  BYTE *pBVar23;
  BYTE *s;
  ushort *puVar24;
  ushort *puVar25;
  BYTE *d;
  BYTE *pBVar26;
  BYTE *e;
  ulong uVar27;
  ulong uStack_c0;
  BYTE *local_80;
  int local_78;
  
  puVar16 = (ushort *)0xffffffffffffffff;
  if (source != (char *)0x0) {
    lVar12 = (long)dictStart + dictSize;
    if (dictStart == (void *)0x0) {
      lVar12 = 0;
    }
    if (maxOutputSize == 0) {
      if (compressedSize == 1) {
        puVar16 = (ushort *)(ulong)-(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      puVar1 = (ushort *)(source + compressedSize);
      pBVar2 = (BYTE *)(dest + maxOutputSize);
      puVar16 = (ushort *)source;
      pBVar26 = (BYTE *)dest;
      if (maxOutputSize < 0x40) goto LAB_00103e39;
      puVar14 = (ushort *)((long)puVar1 - 0xf);
      puVar24 = (ushort *)source;
LAB_001037d2:
      bVar4 = (byte)*puVar24;
      uVar11 = (uint)bVar4;
      puVar25 = (ushort *)((long)puVar24 + 1);
      uVar19 = (ulong)(uint)(bVar4 >> 4);
      puVar16 = puVar25;
      if (bVar4 >> 4 == 0xf) {
        uVar19 = 0xf;
        if (puVar25 < puVar14) {
          uVar10 = 0;
          do {
            uVar7 = *puVar16;
            puVar16 = (ushort *)((long)puVar16 + 1);
            uVar10 = uVar10 + (byte)uVar7;
          } while (puVar16 < puVar14 && (byte)uVar7 == 0xff);
          uVar19 = (ulong)uVar10 + 0xf;
        }
        pBVar13 = pBVar26 + uVar19;
        if (((puVar14 <= puVar25) || (CARRY8((ulong)pBVar26,uVar19))) ||
           (CARRY8((ulong)puVar16,uVar19))) {
          iVar15 = 5;
        }
        else {
          local_80 = pBVar13;
          if ((pBVar2 + -0x20 < pBVar13) || (puVar1 + -0x10 < (ushort *)((long)puVar16 + uVar19))) {
            iVar15 = 6;
          }
          else {
            lVar22 = 0;
            do {
              uVar6 = *(undefined8 *)((byte *)((long)puVar16 + lVar22) + 8);
              pBVar21 = pBVar26 + lVar22;
              *(undefined8 *)pBVar21 = *(undefined8 *)((long)puVar16 + lVar22);
              *(undefined8 *)(pBVar21 + 8) = uVar6;
              pbVar3 = (byte *)((long)puVar16 + lVar22 + 0x10);
              uVar6 = *(undefined8 *)(pbVar3 + 8);
              *(undefined8 *)(pBVar21 + 0x10) = *(undefined8 *)pbVar3;
              *(undefined8 *)(pBVar21 + 0x18) = uVar6;
              lVar22 = lVar22 + 0x20;
            } while (pBVar21 + 0x20 < pBVar13);
            iVar15 = 0;
            puVar16 = (ushort *)((long)puVar16 + uVar19);
            pBVar26 = pBVar13;
          }
        }
        pBVar13 = pBVar26;
        if (iVar15 != 0) {
          if (iVar15 != 5) {
            if (iVar15 == 6) goto LAB_00103c59;
            goto LAB_00103f0d;
          }
          goto LAB_00103f05;
        }
      }
      else {
        local_80 = pBVar26 + uVar19;
        if ((ushort *)((long)puVar1 - 0x11U) < puVar25) goto LAB_00103c59;
        uVar6 = *(undefined8 *)((long)puVar24 + 9);
        *(undefined8 *)pBVar26 = *(undefined8 *)puVar25;
        *(undefined8 *)(pBVar26 + 8) = uVar6;
        puVar16 = (ushort *)(uVar19 + (long)puVar25);
        pBVar13 = local_80;
      }
      uVar7 = *puVar16;
      uVar27 = (ulong)uVar7;
      puVar16 = puVar16 + 1;
      pBVar21 = pBVar13 + -uVar27;
      uVar19 = (ulong)(bVar4 & 0xf);
      if (uVar19 == 0xf) {
        if ((dictSize < 0x10000) && (pBVar21 + dictSize < dest)) {
          iVar15 = 5;
          uStack_c0 = 0xf;
        }
        else {
          uVar11 = 0;
          do {
            uVar8 = *puVar16;
            puVar16 = (ushort *)((long)puVar16 + 1);
            uVar11 = uVar11 + (byte)uVar8;
          } while ((byte)uVar8 == 0xff && puVar16 < puVar1 + -2);
          uVar19 = (ulong)uVar11;
          uStack_c0 = uVar19 + 0xf;
          if ((puVar1 + -2 <= puVar16) || (CARRY8((ulong)pBVar13,uStack_c0))) {
            iVar15 = 5;
          }
          else {
            uStack_c0 = uVar19 + 0x13;
            iVar15 = 7;
            if (pBVar13 + uVar19 + 0x13 < pBVar2 + -0x40) {
              iVar15 = 0;
            }
          }
        }
        if (iVar15 != 0) {
          if (iVar15 != 5) {
            if (iVar15 == 7) goto LAB_00103d01;
            goto LAB_00103f0d;
          }
          goto LAB_00103f05;
        }
      }
      else {
        uStack_c0 = uVar19 + 4;
        if (pBVar2 + -0x40 <= pBVar13 + uVar19 + 4) goto LAB_00103d01;
        if ((dest <= pBVar21) && (7 < uVar7)) {
          *(undefined8 *)pBVar13 = *(undefined8 *)pBVar21;
          *(undefined8 *)(pBVar13 + 8) = *(undefined8 *)(pBVar21 + 8);
          *(undefined2 *)(pBVar13 + 0x10) = *(undefined2 *)(pBVar21 + 0x10);
          puVar24 = puVar16;
          pBVar26 = pBVar13 + uVar19 + 4;
          goto LAB_001037d2;
        }
      }
      if ((dictSize < 0x10000) && (pBVar21 + dictSize < dest)) goto LAB_00103f05;
      pBVar20 = pBVar13 + uStack_c0;
      puVar24 = puVar16;
      pBVar26 = pBVar20;
      if (pBVar21 < dest) {
        if (pBVar2 + -5 < pBVar20) goto LAB_00103f05;
        uVar19 = (long)dest - (long)pBVar21;
        uVar27 = uStack_c0 - uVar19;
        if (uStack_c0 < uVar19 || uVar27 == 0) {
          memmove(pBVar13,(void *)(lVar12 - uVar19),uStack_c0);
        }
        else {
          memcpy(pBVar13,(void *)(lVar12 - uVar19),uVar19);
          pBVar26 = pBVar13 + uVar19;
          if ((ulong)((long)pBVar26 - (long)dest) < uVar27) {
            pBVar13 = (BYTE *)dest;
            if ((long)uVar19 < (long)uStack_c0) {
              do {
                *pBVar26 = *pBVar13;
                pBVar26 = pBVar26 + 1;
                pBVar13 = pBVar13 + 1;
              } while (pBVar26 < pBVar20);
            }
          }
          else {
            memcpy(pBVar26,dest,uVar27);
            pBVar26 = pBVar20;
          }
        }
      }
      else {
        local_80 = pBVar20;
        if (uVar7 < 0x10) {
          LZ4_memcpy_using_offset(pBVar13,pBVar21,pBVar20,uVar27);
        }
        else {
          do {
            uVar6 = *(undefined8 *)(pBVar13 + -uVar27 + 8);
            *(undefined8 *)pBVar13 = *(undefined8 *)(pBVar13 + -uVar27);
            *(undefined8 *)(pBVar13 + 8) = uVar6;
            uVar6 = *(undefined8 *)(pBVar13 + -uVar27 + 0x10 + 8);
            *(undefined8 *)(pBVar13 + 0x10) = *(undefined8 *)(pBVar13 + -uVar27 + 0x10);
            *(undefined8 *)(pBVar13 + 0x18) = uVar6;
            pBVar13 = pBVar13 + 0x20;
          } while (pBVar13 < pBVar20);
        }
      }
      goto LAB_001037d2;
    }
  }
  goto LAB_00103f0d;
LAB_00103d01:
  if ((dictSize < 0x10000) && (pBVar21 + dictSize < dest)) goto LAB_00103f05;
  pBVar20 = pBVar13 + uStack_c0;
  pBVar26 = pBVar20;
  if (pBVar21 < dest) {
    if (pBVar2 + -5 < pBVar20) goto LAB_00103f05;
    uVar19 = (long)dest - (long)pBVar21;
    uVar27 = uStack_c0 - uVar19;
    if (uStack_c0 < uVar19 || uVar27 == 0) {
      memmove(pBVar13,(void *)(lVar12 - uVar19),uStack_c0);
    }
    else {
      memcpy(pBVar13,(void *)(lVar12 - uVar19),uVar19);
      pBVar26 = pBVar13 + uVar19;
      if ((ulong)((long)pBVar26 - (long)dest) < uVar27) {
        pBVar13 = (BYTE *)dest;
        if ((long)uVar19 < (long)uStack_c0) {
          do {
            *pBVar26 = *pBVar13;
            pBVar26 = pBVar26 + 1;
            pBVar13 = pBVar13 + 1;
          } while (pBVar26 < pBVar20);
        }
      }
      else {
        memcpy(pBVar26,dest,uVar27);
        pBVar26 = pBVar20;
      }
    }
  }
  else {
    if ((uint)uVar27 < 8) {
      pBVar13[0] = '\0';
      pBVar13[1] = '\0';
      pBVar13[2] = '\0';
      pBVar13[3] = '\0';
      *pBVar13 = *pBVar21;
      pBVar13[1] = pBVar21[1];
      pBVar13[2] = pBVar21[2];
      pBVar13[3] = pBVar21[3];
      uVar19 = (ulong)((uint)uVar27 << 2);
      uVar27 = (ulong)*(uint *)((long)inc32table + uVar19);
      *(undefined4 *)(pBVar13 + 4) = *(undefined4 *)(pBVar21 + uVar27);
      pBVar21 = pBVar21 + (uVar27 - (long)*(int *)((long)dec64table + uVar19));
    }
    else {
      *(undefined8 *)pBVar13 = *(undefined8 *)pBVar21;
      pBVar21 = pBVar21 + 8;
    }
    pBVar17 = pBVar13 + 8;
    if (pBVar2 + -0xc < pBVar20) {
      iVar15 = 5;
      if (pBVar20 <= pBVar2 + -5) {
        pBVar13 = pBVar2 + -7;
        pBVar18 = pBVar21;
        pBVar23 = pBVar17;
        if (pBVar17 < pBVar13) {
          do {
            *(undefined8 *)pBVar23 = *(undefined8 *)pBVar18;
            pBVar23 = pBVar23 + 8;
            pBVar18 = pBVar18 + 8;
          } while (pBVar23 < pBVar13);
          pBVar21 = pBVar21 + ((long)pBVar13 - (long)pBVar17);
          pBVar17 = pBVar13;
        }
        iVar15 = 0;
        for (; pBVar17 < pBVar20; pBVar17 = pBVar17 + 1) {
          BVar5 = *pBVar21;
          pBVar21 = pBVar21 + 1;
          *pBVar17 = BVar5;
        }
      }
      if (iVar15 != 0) {
        if (iVar15 != 5) goto LAB_00103f0d;
        goto LAB_00103f05;
      }
    }
    else {
      *(undefined8 *)pBVar17 = *(undefined8 *)pBVar21;
      if (0x10 < uStack_c0) {
        pBVar13 = pBVar13 + 0x10;
        do {
          pBVar21 = pBVar21 + 8;
          *(undefined8 *)pBVar13 = *(undefined8 *)pBVar21;
          pBVar13 = pBVar13 + 8;
        } while (pBVar13 < pBVar20);
      }
    }
  }
LAB_00103e39:
  bVar4 = (byte)*puVar16;
  puVar14 = (ushort *)((long)puVar16 + 1);
  while( true ) {
    uVar11 = (uint)bVar4;
    if (bVar4 >> 4 == 0xf) break;
    uVar19 = (ulong)(uint)(bVar4 >> 4);
    if ((source + (long)compressedSize + -0x10 <= puVar14) ||
       (dest + (long)maxOutputSize + -0x20 < pBVar26)) goto LAB_00103c52;
    uVar6 = *(undefined8 *)(puVar14 + 4);
    *(undefined8 *)pBVar26 = *(undefined8 *)puVar14;
    *(undefined8 *)(pBVar26 + 8) = uVar6;
    local_80 = pBVar26 + uVar19;
    uStack_c0 = (ulong)(uVar11 & 0xf);
    puVar24 = (ushort *)((long)puVar14 + uVar19);
    uVar27 = (ulong)*puVar24;
    pBVar21 = local_80 + -uVar27;
    if ((((uVar11 & 0xf) == 0xf) || (*puVar24 < 8)) || (pBVar21 < dest)) goto LAB_00103ca7;
    *(undefined8 *)local_80 = *(undefined8 *)pBVar21;
    *(undefined8 *)(local_80 + 8) = *(undefined8 *)(pBVar21 + 8);
    *(undefined2 *)(local_80 + 0x10) = *(undefined2 *)(pBVar21 + 0x10);
    pBVar26 = local_80 + uStack_c0 + 4;
    bVar4 = *(byte *)((long)puVar14 + uVar19 + 2);
    puVar14 = (ushort *)((long)puVar14 + uVar19 + 3);
  }
  puVar24 = (ushort *)((long)puVar1 - 0xf);
  uVar19 = 0xf;
  puVar16 = puVar14;
  if (puVar14 < puVar24) {
    uVar10 = 0;
    do {
      uVar7 = *puVar16;
      puVar16 = (ushort *)((long)puVar16 + 1);
      uVar10 = uVar10 + (byte)uVar7;
    } while (puVar16 < puVar24 && (byte)uVar7 == 0xff);
    uVar19 = (ulong)uVar10 + 0xf;
  }
  if (((puVar24 <= puVar14) || (CARRY8((ulong)pBVar26,uVar19))) ||
     (puVar14 = puVar16, CARRY8((ulong)puVar16,uVar19))) goto LAB_00103f05;
LAB_00103c52:
  local_80 = pBVar26 + uVar19;
  puVar16 = puVar14;
LAB_00103c59:
  puVar24 = (ushort *)((long)puVar16 + uVar19);
  if ((pBVar2 + -0xc < local_80) || (puVar1 + -4 < puVar24)) {
    if ((puVar24 != puVar1) || (pBVar2 < local_80)) goto LAB_00103f05;
    memmove(pBVar26,puVar16,uVar19);
    puVar16 = (ushort *)(ulong)(uint)(((int)pBVar26 + (int)uVar19) - (int)dest);
    goto LAB_00103f0d;
  }
  do {
    *(undefined8 *)pBVar26 = *(undefined8 *)puVar16;
    pBVar26 = pBVar26 + 8;
    puVar16 = puVar16 + 4;
  } while (pBVar26 < local_80);
  uVar27 = (ulong)*puVar24;
  pBVar21 = local_80 + -uVar27;
  uStack_c0 = (ulong)(uVar11 & 0xf);
LAB_00103ca7:
  puVar16 = puVar24 + 1;
  if ((int)uStack_c0 == 0xf) {
    uVar11 = 0;
    do {
      uVar7 = *puVar16;
      puVar16 = (ushort *)((long)puVar16 + 1);
      uVar11 = uVar11 + (byte)uVar7;
    } while (puVar16 < puVar1 + -2 && (byte)uVar7 == 0xff);
    uStack_c0 = (ulong)uVar11 + 0xf;
    cVar9 = '\x05';
    if (puVar16 < puVar1 + -2) {
      cVar9 = CARRY8((ulong)local_80,uStack_c0) * '\x05';
    }
    if (cVar9 != '\0') goto LAB_00103e58;
  }
  uStack_c0 = uStack_c0 + 4;
  pBVar13 = local_80;
  goto LAB_00103d01;
LAB_00103e58:
  if (cVar9 == '\x05') {
LAB_00103f05:
    local_78 = (int)source;
    puVar16 = (ushort *)(ulong)(~(uint)puVar16 + local_78);
  }
LAB_00103f0d:
  return (int)puVar16;
}

Assistant:

LZ4_FORCE_O2_GCC_PPC64LE
int LZ4_decompress_safe_forceExtDict(const char* source, char* dest,
                                     int compressedSize, int maxOutputSize,
                                     const void* dictStart, size_t dictSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxOutputSize,
                                  endOnInputSize, decode_full_block, usingExtDict,
                                  (BYTE*)dest, (const BYTE*)dictStart, dictSize);
}